

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  byte bVar1;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  OneofDescriptor *pOVar4;
  undefined8 *puVar5;
  long lVar6;
  pointer pcVar7;
  size_type sVar8;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  anon_union_216_1_493b367e_for_DescriptorProto_4 *paVar9;
  DescriptorProto *pDVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  int iVar14;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar15;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *pVVar16;
  int iVar17;
  long lVar18;
  int *piVar19;
  DescriptorBuilder *pDVar20;
  ulong uVar21;
  long lVar22;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  OneofDescriptor *oneof_decl;
  uint local_134;
  DescriptorBuilder *local_130;
  Descriptor *local_128;
  DescriptorProto *local_120;
  undefined1 local_118 [32];
  OneofDescriptor *local_f8;
  AlphaNum local_f0;
  RepeatedPtrFieldBase *local_c0;
  Descriptor **local_b8;
  uint *local_b0;
  OneofDescriptor **local_a8;
  VoidPtr local_a0;
  code *pcStack_98;
  size_type local_90;
  pointer local_88;
  AlphaNum local_60;
  
  local_128 = message;
  local_120 = proto;
  if (0 < message->nested_type_count_) {
    lVar18 = 0;
    lVar22 = 0;
    do {
      pDVar2 = message->nested_types_;
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                            (int)lVar22);
      CrossLinkMessage(this,(Descriptor *)(&pDVar2->super_SymbolBase + lVar18),proto_00);
      lVar22 = lVar22 + 1;
      lVar18 = lVar18 + 0x98;
    } while (lVar22 < message->nested_type_count_);
  }
  uVar21 = (ulong)(uint)message->field_count_;
  local_130 = this;
  if (0 < message->field_count_) {
    paVar9 = &local_120->field_0;
    lVar22 = 0;
    lVar18 = 0;
    do {
      pFVar3 = message->fields_;
      pVVar15 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (&(paVar9->_impl_).field_.super_RepeatedPtrFieldBase,(int)lVar18);
      CrossLinkField(this,(FieldDescriptor *)(&pFVar3->super_SymbolBase + lVar22),pVVar15);
      lVar18 = lVar18 + 1;
      uVar21 = (ulong)message->field_count_;
      lVar22 = lVar22 + 0x58;
    } while (lVar18 < (long)uVar21);
  }
  pDVar20 = local_130;
  piVar19 = &message->field_count_;
  if (0 < message->extension_count_) {
    local_c0 = &(local_120->field_0)._impl_.extension_.super_RepeatedPtrFieldBase;
    lVar22 = 0;
    lVar18 = 0;
    do {
      pFVar3 = message->extensions_;
      pVVar15 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (local_c0,(int)lVar18);
      CrossLinkField(pDVar20,(FieldDescriptor *)(&pFVar3->super_SymbolBase + lVar22),pVVar15);
      lVar18 = lVar18 + 1;
      lVar22 = lVar22 + 0x58;
    } while (lVar18 < message->extension_count_);
    uVar21 = (ulong)(uint)*piVar19;
  }
  pDVar10 = local_120;
  local_134 = 0;
  if (0 < (int)uVar21) {
    paVar9 = &local_120->field_0;
    do {
      if ((int)local_134 < 0) {
        CrossLinkMessage();
LAB_001f78ab:
        CrossLinkMessage();
LAB_001f78b5:
        CrossLinkMessage();
LAB_001f78c1:
        CrossLinkMessage();
LAB_001f78d0:
        CrossLinkMessage();
LAB_001f78da:
        CrossLinkMessage();
LAB_001f78e4:
        CrossLinkMessage();
LAB_001f78f1:
        CrossLinkMessage();
LAB_001f78fb:
        CrossLinkMessage();
        goto LAB_001f7905;
      }
      if ((int)uVar21 <= (int)local_134) goto LAB_001f78ab;
      pFVar3 = message->fields_;
      if ((pFVar3[local_134].field_0x1 & 0x10) != 0) {
        pOVar4 = pFVar3[local_134].scope_.containing_oneof;
        if (pOVar4 == (OneofDescriptor *)0x0) goto LAB_001f7905;
        pDVar20 = local_130;
        local_f8 = pOVar4;
        if (pOVar4->field_count_ < 1) {
LAB_001f75b0:
          pOVar4 = message->oneof_decls_;
          iVar17 = (int)((ulong)((long)local_f8 - (long)local_f8->containing_type_->oneof_decls_) >>
                        3) * -0x49249249;
          iVar14 = pOVar4[iVar17].field_count_;
          if ((long)iVar14 != 0) {
LAB_001f7606:
            if (pDVar20->had_errors_ != false) {
LAB_001f7642:
              pOVar4[iVar17].field_count_ = iVar14 + 1;
              goto LAB_001f764b;
            }
            if ((long)(int)local_134 < 0) goto LAB_001f78d0;
            if (message->field_count_ <= (int)local_134) goto LAB_001f78da;
            if (pOVar4[iVar17].fields_ + iVar14 == message->fields_ + (int)local_134)
            goto LAB_001f7642;
            goto LAB_001f78e4;
          }
          if ((long)(int)local_134 < 0) goto LAB_001f78f1;
          if ((int)local_134 < message->field_count_) {
            pOVar4[iVar17].fields_ = message->fields_ + (int)local_134;
            message = local_128;
            goto LAB_001f7606;
          }
          goto LAB_001f78fb;
        }
        uVar13 = local_134 - 1;
        if (local_134 == 0) goto LAB_001f78b5;
        if ((pFVar3[uVar13].field_0x1 & 0x10) != 0) {
          if (pFVar3[uVar13].scope_.containing_oneof == (OneofDescriptor *)0x0) goto LAB_001f7905;
          if (pFVar3[uVar13].scope_.containing_oneof == pOVar4) goto LAB_001f75b0;
        }
        local_f0.piece_._M_str = message->all_names_[1]._M_dataplus._M_p;
        local_f0.piece_._M_len = message->all_names_[1]._M_string_length;
        local_60.piece_._M_len = 1;
        local_60.piece_._M_str = ".";
        if ((int)local_134 <= *piVar19) {
          local_88 = ((pFVar3[uVar13].all_names_)->_M_dataplus)._M_p;
          local_90 = (pFVar3[uVar13].all_names_)->_M_string_length;
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_118,&local_f0,&local_60);
          uVar12 = local_118._8_8_;
          uVar11 = local_118._0_8_;
          pVVar15 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                              (&(paVar9->_impl_).field_.super_RepeatedPtrFieldBase,local_134 - 1);
          pDVar20 = local_130;
          local_b8 = &local_128;
          local_b0 = &local_134;
          local_a8 = &local_f8;
          pcStack_98 = absl::lts_20240722::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error.invoker_ =
               absl::lts_20240722::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error.ptr_.obj = &local_b8;
          element_name._M_str = (char *)uVar11;
          element_name._M_len = uVar12;
          local_a0.obj = &local_b8;
          AddError(local_130,element_name,&pVVar15->super_Message,TYPE,make_error);
          message = local_128;
          if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
            operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
            message = local_128;
          }
          goto LAB_001f75b0;
        }
        goto LAB_001f78c1;
      }
LAB_001f764b:
      local_134 = local_134 + 1;
      piVar19 = &message->field_count_;
      uVar21 = (ulong)(uint)message->field_count_;
    } while ((int)local_134 < message->field_count_);
  }
  if (0 < message->oneof_decl_count_) {
    lVar18 = 8;
    lVar22 = 0;
    do {
      if (*(int *)((long)message->oneof_decls_ + lVar18 + -4) == 0) {
        local_f0.piece_._M_str = message->all_names_[1]._M_dataplus._M_p;
        local_f0.piece_._M_len = message->all_names_[1]._M_string_length;
        local_60.piece_._M_len = 1;
        local_60.piece_._M_str = ".";
        puVar5 = *(undefined8 **)(&message->oneof_decls_->super_SymbolBase + lVar18);
        local_88 = (pointer)*puVar5;
        local_90 = puVar5[1];
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_118,&local_f0,&local_60);
        uVar12 = local_118._8_8_;
        uVar11 = local_118._0_8_;
        pVVar16 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                            (&(pDVar10->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                             (int)lVar22);
        element_name_00._M_str = (char *)uVar11;
        element_name_00._M_len = uVar12;
        AddError(local_130,element_name_00,&pVVar16->super_Message,NAME,
                 "Oneof must have at least one field.");
        message = local_128;
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
          message = local_128;
        }
      }
      lVar22 = lVar22 + 1;
      lVar18 = lVar18 + 0x38;
    } while (lVar22 < message->oneof_decl_count_);
  }
  if (0 < message->field_count_) {
    lVar22 = 0x28;
    lVar18 = 0;
    do {
      bVar1 = *(byte *)((long)message->fields_ + lVar22 + -0x27);
      if ((bVar1 & 2) != 0) {
        if ((bVar1 & 0x10) != 0) {
          lVar6 = *(long *)(&message->fields_->super_SymbolBase + lVar22);
          if (lVar6 == 0) {
LAB_001f7905:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xa9a);
          }
          if ((*(int *)(lVar6 + 4) == 1) && ((*(byte *)(*(long *)(lVar6 + 0x30) + 1) & 2) != 0))
          goto LAB_001f77e0;
        }
        pcVar7 = message->all_names_[1]._M_dataplus._M_p;
        sVar8 = message->all_names_[1]._M_string_length;
        pVVar15 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                            (&(pDVar10->field_0)._impl_.field_.super_RepeatedPtrFieldBase,
                             (int)lVar18);
        element_name_01._M_str = pcVar7;
        element_name_01._M_len = sVar8;
        AddError(local_130,element_name_01,&pVVar15->super_Message,OTHER,
                 "Fields with proto3_optional set must be a member of a one-field oneof");
        message = local_128;
      }
LAB_001f77e0:
      lVar18 = lVar18 + 1;
      lVar22 = lVar22 + 0x58;
    } while (lVar18 < message->field_count_);
  }
  iVar14 = message->oneof_decl_count_;
  if (0 < message->oneof_decl_count_) {
    iVar17 = -1;
    lVar22 = 0x30;
    lVar18 = 0;
    do {
      if ((*(int *)((long)message->oneof_decls_ + lVar22 + -0x2c) == 1) &&
         ((*(byte *)(*(long *)(&message->oneof_decls_->super_SymbolBase + lVar22) + 1) & 2) != 0)) {
        if (iVar17 == -1) {
          iVar17 = (int)lVar18;
        }
      }
      else if (iVar17 == -1) {
        iVar17 = -1;
      }
      else {
        pcVar7 = message->all_names_[1]._M_dataplus._M_p;
        sVar8 = message->all_names_[1]._M_string_length;
        pVVar16 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                            (&(pDVar10->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                             (int)lVar18);
        element_name_02._M_str = pcVar7;
        element_name_02._M_len = sVar8;
        AddError(local_130,element_name_02,&pVVar16->super_Message,OTHER,
                 "Synthetic oneofs must be after all other oneofs");
        message = local_128;
      }
      lVar18 = lVar18 + 1;
      lVar22 = lVar22 + 0x38;
    } while (lVar18 < message->oneof_decl_count_);
    iVar14 = message->oneof_decl_count_;
    if (iVar17 != -1) {
      iVar14 = iVar17;
    }
  }
  message->real_oneof_decl_count_ = iVar14;
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(
            absl::StrCat(message->full_name(), ".",
                         message->field(i - 1)->name()),
            proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE, [&] {
              return absl::Substitute(
                  "Fields in the same oneof must be defined consecutively. "
                  "\"$0\" cannot be defined before the completion of the "
                  "\"$1\" oneof definition.",
                  message->field(i - 1)->name(), oneof_decl->name());
            });
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      auto& out_oneof_decl = message->oneof_decls_[oneof_decl->index()];
      if (out_oneof_decl.field_count_ == 0) {
        out_oneof_decl.fields_ = message->field(i);
      }

      if (!had_errors_) {
        // Verify that they are contiguous.
        // This is assumed by OneofDescriptor::field(i).
        // But only if there are no errors.
        ABSL_CHECK_EQ(out_oneof_decl.fields_ + out_oneof_decl.field_count_,
                      message->field(i));
      }
      ++out_oneof_decl.field_count_;
    }
  }

  // Then verify the sizes.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(absl::StrCat(message->full_name(), ".", oneof_decl->name()),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }
  }

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->proto3_optional_) {
      if (!field->containing_oneof() ||
          !field->containing_oneof()->is_synthetic()) {
        AddError(message->full_name(), proto.field(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Fields with proto3_optional set must be "
                 "a member of a one-field oneof");
      }
    }
  }

  // Synthetic oneofs must be last.
  int first_synthetic = -1;
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    if (message->oneof_decl(i)->is_synthetic()) {
      if (first_synthetic == -1) {
        first_synthetic = i;
      }
    } else {
      if (first_synthetic != -1) {
        AddError(message->full_name(), proto.oneof_decl(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Synthetic oneofs must be after all other oneofs");
      }
    }
  }

  if (first_synthetic == -1) {
    message->real_oneof_decl_count_ = message->oneof_decl_count_;
  } else {
    message->real_oneof_decl_count_ = first_synthetic;
  }
}